

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QPolygonF * __thiscall
QGraphicsItem::mapToItem(QGraphicsItem *this,QGraphicsItem *item,QRectF *rect)

{
  QRectF *in_RCX;
  long in_RDX;
  QRectF *in_RSI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *unaff_retaddr;
  QPolygonF local_70 [4];
  bool *in_stack_fffffffffffffff0;
  QGraphicsItem *other;
  
  other = *(QGraphicsItem **)(in_FS_OFFSET + 0x28);
  if (in_RDX == 0) {
    mapToScene(in_RDI,in_RSI);
  }
  else {
    itemTransform(unaff_retaddr,other,in_stack_fffffffffffffff0);
    QPolygonF::QPolygonF(local_70,in_RCX);
    QTransform::map((QPolygonF *)in_RDI);
    QPolygonF::~QPolygonF((QPolygonF *)0x9831c2);
  }
  if (*(QGraphicsItem **)(in_FS_OFFSET + 0x28) == other) {
    return (QPolygonF *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF QGraphicsItem::mapToItem(const QGraphicsItem *item, const QRectF &rect) const
{
    if (item)
        return itemTransform(item).map(rect);
    return mapToScene(rect);
}